

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.c
# Opt level: O3

void ecatcheck(void *ptr)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_38;
  
  local_38 = &DAT_0010630d;
  do {
    if ((inOP != '\0') &&
       ((wkc < expectedWKC || ((&DAT_001060e2)[(ulong)currentgroup * 0x138] != '\0')))) {
      if (needlf != '\0') {
        needlf = '\0';
        putchar(10);
      }
      (&DAT_001060e2)[(ulong)currentgroup * 0x138] = 0;
      ec_readstate();
      if (0 < _ec_slavecount) {
        uVar3 = 1;
        lVar4 = 0;
        pcVar6 = local_38;
        do {
          if (pcVar6[-2] == currentgroup) {
            sVar1 = *(short *)(pcVar6 + -0x10d);
            if (sVar1 != 8) {
              (&DAT_001060e2)[(ulong)(byte)pcVar6[-2] * 0x138] = 1;
              if (sVar1 == 0) {
                if (*pcVar6 == '\0') {
                  ec_statecheck(uVar3 & 0xffff,8,2000);
                  if (*(short *)(pcVar6 + -0x10d) == 0) {
                    *pcVar6 = '\x01';
                    pcVar5 = "ERROR : slave %d lost\n";
LAB_0010175d:
                    printf(pcVar5,uVar3);
                  }
                }
              }
              else {
                if (sVar1 == 4) {
                  printf("WARNING : slave %d is in SAFE_OP, change to OPERATIONAL.\n",uVar3);
                  pcVar6[-0x10d] = '\b';
                  pcVar6[-0x10c] = '\0';
                }
                else {
                  if (sVar1 != 0x14) {
                    iVar2 = ec_reconfig_slave(uVar3 & 0xffff,500);
                    if (iVar2 != 0) {
                      *pcVar6 = '\0';
                      pcVar5 = "MESSAGE : slave %d reconfigured\n";
                      goto LAB_0010175d;
                    }
                    goto LAB_00101766;
                  }
                  printf("ERROR : slave %d is in SAFE_OP + ERROR, attempting ack.\n",uVar3);
                  pcVar6[-0x10d] = '\x14';
                  pcVar6[-0x10c] = '\0';
                }
                ec_writestate(uVar3 & 0xffff);
              }
            }
          }
LAB_00101766:
          if (*pcVar6 != '\0') {
            if (*(short *)(pcVar6 + -0x10d) == 0) {
              iVar2 = ec_recover_slave(uVar3 & 0xffff,500);
              if (iVar2 == 0) goto LAB_001017a9;
              *pcVar6 = '\0';
              pcVar5 = "MESSAGE : slave %d recovered\n";
            }
            else {
              *pcVar6 = '\0';
              pcVar5 = "MESSAGE : slave %d found\n";
            }
            printf(pcVar5,uVar3);
          }
LAB_001017a9:
          uVar3 = (ulong)((int)uVar3 + 1);
          lVar4 = lVar4 + 1;
          pcVar6 = pcVar6 + 0x148;
        } while (lVar4 < _ec_slavecount);
      }
      if ((&DAT_001060e2)[(ulong)currentgroup * 0x138] == '\0') {
        puts("OK : all slaves resumed OPERATIONAL.");
      }
    }
    usleep(10000);
  } while( true );
}

Assistant:

void ecatcheck( void *ptr )
{
    int slave;

    while(1)
    {
        if( inOP && ((wkc < expectedWKC) || ec_group[currentgroup].docheckstate))
        {
            if (needlf)
            {
               needlf = FALSE;
               printf("\n");
            }
            /* one ore more slaves are not responding */
            ec_group[currentgroup].docheckstate = FALSE;
            ec_readstate();
            for (slave = 1; slave <= ec_slavecount; slave++)
            {
               if ((ec_slave[slave].group == currentgroup) && (ec_slave[slave].state != EC_STATE_OPERATIONAL))
               {
                  ec_group[currentgroup].docheckstate = TRUE;
                  if (ec_slave[slave].state == (EC_STATE_SAFE_OP + EC_STATE_ERROR))
                  {
                     printf("ERROR : slave %d is in SAFE_OP + ERROR, attempting ack.\n", slave);
                     ec_slave[slave].state = (EC_STATE_SAFE_OP + EC_STATE_ACK);
                     ec_writestate(slave);
                  }
                  else if(ec_slave[slave].state == EC_STATE_SAFE_OP)
                  {
                     printf("WARNING : slave %d is in SAFE_OP, change to OPERATIONAL.\n", slave);
                     ec_slave[slave].state = EC_STATE_OPERATIONAL;
                     ec_writestate(slave);                              
                  }
                  else if(ec_slave[slave].state > 0)
                  {
                     if (ec_reconfig_slave(slave, EC_TIMEOUTMON))
                     {
                        ec_slave[slave].islost = FALSE;
                        printf("MESSAGE : slave %d reconfigured\n",slave);                           
                     }
                  } 
                  else if(!ec_slave[slave].islost)
                  {
                     /* re-check state */
                     ec_statecheck(slave, EC_STATE_OPERATIONAL, EC_TIMEOUTRET);
                     if (!ec_slave[slave].state)
                     {
                        ec_slave[slave].islost = TRUE;
                        printf("ERROR : slave %d lost\n",slave);                           
                     }
                  }
               }
               if (ec_slave[slave].islost)
               {
                  if(!ec_slave[slave].state)
                  {
                     if (ec_recover_slave(slave, EC_TIMEOUTMON))
                     {
                        ec_slave[slave].islost = FALSE;
                        printf("MESSAGE : slave %d recovered\n",slave);                           
                     }
                  }
                  else
                  {
                     ec_slave[slave].islost = FALSE;
                     printf("MESSAGE : slave %d found\n",slave);                           
                  }
               }
            }
            if(!ec_group[currentgroup].docheckstate)
               printf("OK : all slaves resumed OPERATIONAL.\n");
        }
        usleep(10000);
    }   
}